

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shortest-paths.hxx
# Opt level: O0

void andres::graph::graph_detail::spspHelper<unsigned_long>
               (vector<long,_std::allocator<long>_> *parents,unsigned_long vPositive,
               unsigned_long vNegative,deque<unsigned_long,_std::allocator<unsigned_long>_> *path)

{
  const_reference pvVar1;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  value_type_conflict1 *in_RDX;
  value_type_conflict1 *in_RSI;
  vector<long,_std::allocator<long>_> *in_RDI;
  unsigned_long t;
  
  while( true ) {
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_front(in_RCX,in_RSI);
    pvVar1 = std::vector<long,_std::allocator<long>_>::operator[](in_RDI,(size_type)in_RSI);
    if ((value_type_conflict1 *)(*pvVar1 + -1) == in_RSI) break;
    pvVar1 = std::vector<long,_std::allocator<long>_>::operator[](in_RDI,(size_type)in_RSI);
    in_RSI = (value_type_conflict1 *)(*pvVar1 + -1);
  }
  while( true ) {
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back(in_RCX,in_RDX);
    pvVar1 = std::vector<long,_std::allocator<long>_>::operator[](in_RDI,(size_type)in_RDX);
    if ((value_type_conflict1 *)(-1 - *pvVar1) == in_RDX) break;
    pvVar1 = std::vector<long,_std::allocator<long>_>::operator[](in_RDI,(size_type)in_RDX);
    in_RDX = (value_type_conflict1 *)(-1 - *pvVar1);
  }
  return;
}

Assistant:

inline void
spspHelper(
    const std::vector<std::ptrdiff_t>& parents,
    const T vPositive,
    const T vNegative,
    std::deque<T>& path
) {
    assert(vPositive >= 0);
    assert(vNegative >= 0);
    T t = vPositive;
    for(;;) {
        path.push_front(t);
        if(parents[t] - 1 == t) {
            break;
        }
        else {
            t = parents[t] - 1;
        }
    }
    t = vNegative;
    for(;;) {
        path.push_back(t);
        if(-parents[t] - 1 == t) {
            break;
        }
        else {
            t = -parents[t] - 1;
        }
    }
}